

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Traversal.cpp
# Opt level: O0

bool __thiscall
iDynTree::Traversal::isParentOf(Traversal *this,LinkIndex parentCandidate,LinkIndex childCandidate)

{
  const_reference pvVar1;
  Link *pLVar2;
  LinkIndex LVar3;
  size_type in_RDX;
  long in_RSI;
  Traversal *in_RDI;
  LinkConstPtr parentPtr;
  LinkIndex in_stack_ffffffffffffffc8;
  bool local_1;
  
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&in_RDI->linkIndexToTraversalIndex,in_RDX);
  if (*pvVar1 == -1) {
    local_1 = false;
  }
  else {
    pLVar2 = getParentLinkFromLinkIndex(in_RDI,in_stack_ffffffffffffffc8);
    if (pLVar2 == (Link *)0x0) {
      local_1 = false;
    }
    else {
      pLVar2 = getParentLinkFromLinkIndex(in_RDI,in_stack_ffffffffffffffc8);
      LVar3 = Link::getIndex(pLVar2);
      local_1 = LVar3 == in_RSI;
    }
  }
  return local_1;
}

Assistant:

bool Traversal::isParentOf(const LinkIndex parentCandidate,
                           const LinkIndex childCandidate) const
{
    assert(childCandidate  < this->linkIndexToTraversalIndex.size());
    assert(parentCandidate < this->linkIndexToTraversalIndex.size());
    assert(childCandidate  >= 0);
    assert(parentCandidate >= 0);

    // If the childCandidate is not in the traversal, then clearly
    // the parentCandidate is not its parent for this traversal
    if( linkIndexToTraversalIndex[childCandidate] == -1 )
    {
        return false;
    }

    LinkConstPtr parentPtr = this->getParentLinkFromLinkIndex(childCandidate);
    if( parentPtr == 0 )
    {
        return false;
    }
    else
    {
        return (this->getParentLinkFromLinkIndex(childCandidate)->getIndex() == parentCandidate);
    }
}